

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall JSON::Parser::unexpected(Parser *this,int current)

{
  int __val;
  Position PVar1;
  ostream *poVar2;
  string sStack_1b8;
  string local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string source;
  string msg;
  string str;
  
  checkEndOfUnexpected(this,current);
  std::__cxx11::string::string((string *)&source,(string *)&this->input);
  getStringAt(&str,&source,this->pos);
  PVar1 = getPosition(&source,current);
  std::operator+(&local_158,"Uncaught SyntaxError: Unexpected token ",&str);
  std::operator+(&local_138,&local_158," in JSON at position ");
  __val = getStringIndexAt(&source,current);
  std::__cxx11::to_string(&local_178,__val);
  std::operator+(&local_118,&local_138,&local_178);
  std::operator+(&local_f8,&local_118," (line ");
  std::__cxx11::to_string(&local_198,PVar1.line);
  std::operator+(&local_d8,&local_f8,&local_198);
  std::operator+(&local_b8,&local_d8,", column ");
  std::__cxx11::to_string(&sStack_1b8,PVar1.column);
  std::operator+(&local_98,&local_b8,&sStack_1b8);
  std::operator+(&msg,&local_98,")");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&msg);
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

void Parser::unexpected(int current) {
        checkEndOfUnexpected(current);

        string source = input;
        string str = getStringAt(source, pos);
        Position position = getPosition(source, current);
        string msg = "Uncaught SyntaxError: Unexpected token "
                     + str + " in JSON at position " + to_string(getStringIndexAt(source, current))
                     + " (line " + to_string(position.line) + ", column " + to_string(position.column) + ")";
        cerr << msg << endl;
        exit(1);
    }